

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

int satoko_solve(solver_t *s)

{
  long lVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  if (s == (solver_t *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x13e,"int satoko_solve(solver_t *)");
  }
  lVar4 = (s->stats).n_propagations_all;
  lVar1 = (s->stats).n_conflicts_all;
  (s->stats).n_conflicts_all = 0;
  (s->stats).n_original_lits = 0;
  (s->stats).n_propagations = 0;
  (s->stats).n_propagations_all = 0;
  (s->stats).n_starts = 0;
  (s->stats).n_reduce_db = 0;
  (s->stats).n_decisions = 0;
  (s->stats).n_inspects = 0;
  (s->stats).n_conflicts = 0;
  (s->stats).n_learnt_lits = 0;
  (s->stats).n_conflicts_all = lVar1;
  (s->stats).n_propagations_all = lVar4;
  if (s->status == 0) {
    puts("Satoko in inconsistent state");
LAB_0055ef12:
    iVar3 = 0;
  }
  else {
    if ((s->opts).no_simplify == '\0') {
      iVar3 = satoko_simplify(s);
      if (iVar3 == 0) goto LAB_0055ef12;
    }
    do {
      cVar2 = solver_search(s);
      lVar4 = (s->opts).conf_limit;
      if ((((lVar4 != 0) && (lVar4 < (s->stats).n_conflicts)) ||
          ((lVar4 = (s->opts).prop_limit, lVar4 != 0 && (lVar4 < (s->stats).n_propagations)))) ||
         ((s->pstop != (int *)0x0 && (*s->pstop != 0)))) break;
      if (s->nRuntimeLimit != 0) {
        iVar3 = clock_gettime(3,&local_30);
        if (iVar3 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
        }
        if (s->nRuntimeLimit < lVar4) break;
      }
      if (s->pFuncStop != (_func_int_int *)0x0) {
        iVar3 = (*s->pFuncStop)(s->RunId);
        if (iVar3 != 0) break;
      }
    } while (cVar2 == '\0');
    if ((s->opts).verbose != '\0') {
      printf("starts        : %10d\n",(ulong)(s->stats).n_starts);
      printf("conflicts     : %10ld\n",(s->stats).n_conflicts);
      printf("decisions     : %10ld\n",(s->stats).n_decisions);
      printf("propagations  : %10ld\n",(s->stats).n_propagations);
    }
    iVar3 = (int)cVar2;
    solver_cancel_until(s,s->assumptions->size);
  }
  return iVar3;
}

Assistant:

int satoko_solve(solver_t *s)
{
    int status = SATOKO_UNDEC;

    assert(s);
    solver_clean_stats(s);
    //if (s->opts.verbose)
    //    print_opts(s);
    if (s->status == SATOKO_ERR) {
        printf("Satoko in inconsistent state\n");
        return SATOKO_UNDEC;
    }

    if (!s->opts.no_simplify)
        if (satoko_simplify(s) != SATOKO_OK)
            return SATOKO_UNDEC;

    while (status == SATOKO_UNDEC) {
        status = solver_search(s);
        if (solver_check_limits(s) == 0 || solver_stop(s))
            break;
        if (s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit)
            break;
        if (s->pFuncStop && s->pFuncStop(s->RunId))
            break;
    }
    if (s->opts.verbose)
        print_stats(s);
    
    solver_cancel_until(s, vec_uint_size(s->assumptions));
    return status;
}